

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpx_helper.c
# Opt level: O0

uint64_t helper_bndldx32_x86_64(CPUX86State *env,target_ulong base,target_ulong ptr)

{
  uint32_t uVar1;
  uintptr_t unaff_retaddr;
  undefined4 local_34;
  uint32_t pt;
  uint32_t ub;
  uint32_t lb;
  uint32_t bte;
  uintptr_t ra;
  target_ulong ptr_local;
  target_ulong base_local;
  CPUX86State *env_local;
  
  uVar1 = lookup_bte32(env,(uint32_t)base,unaff_retaddr);
  pt = cpu_ldl_data_ra_x86_64(env,(ulong)uVar1,unaff_retaddr);
  local_34 = cpu_ldl_data_ra_x86_64(env,(ulong)(uVar1 + 4),unaff_retaddr);
  uVar1 = cpu_ldl_data_ra_x86_64(env,(ulong)(uVar1 + 8),unaff_retaddr);
  if (uVar1 != ptr) {
    local_34 = 0;
    pt = 0;
  }
  return CONCAT44(local_34,pt);
}

Assistant:

uint64_t helper_bndldx32(CPUX86State *env, target_ulong base, target_ulong ptr)
{
    uintptr_t ra = GETPC();
    uint32_t bte, lb, ub, pt;

    bte = lookup_bte32(env, base, ra);
    lb = cpu_ldl_data_ra(env, bte, ra);
    ub = cpu_ldl_data_ra(env, bte + 4, ra);
    pt = cpu_ldl_data_ra(env, bte + 8, ra);

    if (pt != ptr) {
        lb = ub = 0;
    }
    return ((uint64_t)ub << 32) | lb;
}